

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_imagemagick_external
          (CImg<unsigned_char> *this,char *filename)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  CImg<char> *pCVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  FILE *pFVar9;
  CImgArgumentException *this_00;
  CImgIOException *pCVar10;
  uint uVar11;
  ulong uVar12;
  char *pcVar13;
  char cVar14;
  char *pcVar15;
  char cVar16;
  char *pcVar17;
  bool bVar18;
  CImg<char> local_b0;
  CImg<char> filename_tmp;
  CImg<char> command;
  CImg<char> s_filename;
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar17 = "non-";
    if (this->_is_shared != false) {
      pcVar17 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_imagemagick_external(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar17,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  if ((*filename != '-') || ((pFVar9 = _stdin, filename[1] != '.' && (filename[1] != '\0')))) {
    pFVar9 = fopen(filename,"rb");
  }
  if (pFVar9 == (FILE *)0x0) {
    pCVar10 = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgIOException::CImgIOException
              (pCVar10,"cimg::fopen(): Failed to open file \'%s\' with mode \'%s\'.",filename,"rb");
    __cxa_throw(pCVar10,&CImgIOException::typeinfo,CImgException::~CImgException);
  }
  fclose(pFVar9);
  CImg<char>::CImg(&command,0x400,1,1,1);
  CImg<char>::CImg(&filename_tmp,0x100,1,1,1);
  sVar4 = strlen(filename);
  CImg<char>::CImg(&local_b0,filename,(int)sVar4 + 1,1,1,1,false);
  pCVar5 = CImg<char>::_system_strescape(&local_b0);
  CImg<char>::CImg(&s_filename,pCVar5);
  if ((local_b0._is_shared == false) && (local_b0._data != (char *)0x0)) {
    operator_delete__(local_b0._data);
  }
  pcVar17 = command._data;
  uVar12 = (ulong)command._width;
  pcVar6 = cimg::imagemagick_path((char *)0x0,false);
  pcVar15 = filename;
  do {
    pcVar13 = pcVar15;
    pcVar7 = strchr(pcVar13,0x2e);
    pcVar15 = pcVar7 + 1;
  } while (filename <= pcVar7 + 1);
  if (pcVar13 == filename) {
    sVar4 = strlen(filename);
    pcVar13 = filename + sVar4;
  }
  sVar4 = strlen(pcVar13);
  iVar2 = (int)sVar4;
  iVar3 = 3;
  if (iVar2 < 3) {
    iVar3 = iVar2;
  }
  uVar11 = iVar3 + 1;
  if (uVar11 == 0) {
    pcVar15 = " -density 400x400";
  }
  else {
    if (iVar2 < 0) {
      bVar18 = true;
      uVar8 = 0;
    }
    else {
      iVar3 = 3;
      if (iVar2 < 3) {
        iVar3 = iVar2;
      }
      uVar8 = 0;
      do {
        cVar1 = pcVar13[uVar8];
        cVar14 = cVar1 + ' ';
        if ((byte)(cVar1 + 0xa5U) < 0xe6) {
          cVar14 = cVar1;
        }
        cVar1 = "pdf"[uVar8];
        cVar16 = cVar1 + ' ';
        if ((byte)(cVar1 + 0xa5U) < 0xe6) {
          cVar16 = cVar1;
        }
        bVar18 = cVar14 == cVar16;
        if (!bVar18) goto LAB_00142b0f;
        uVar8 = uVar8 + 1;
      } while (iVar3 + 1 != (int)uVar8);
      uVar8 = (ulong)uVar11;
    }
LAB_00142b0f:
    pcVar15 = "";
    if (bVar18) {
      pcVar15 = " -density 400x400";
    }
    if ((uint)uVar8 == uVar11) {
      pcVar15 = " -density 400x400";
    }
  }
  snprintf(pcVar17,uVar12,"%s%s \"%s\" pnm:-",pcVar6,pcVar15,s_filename._data);
  pFVar9 = popen(command._data,"r");
  if (pFVar9 == (FILE *)0x0) {
    while( true ) {
      pcVar17 = filename_tmp._data;
      uVar12 = (ulong)filename_tmp._width;
      pcVar15 = cimg::temporary_path((char *)0x0,false);
      pcVar6 = cimg::filenamerand();
      snprintf(pcVar17,uVar12,"%s%c%s.pnm",pcVar15,0x2f,pcVar6);
      pFVar9 = fopen(filename_tmp._data,"rb");
      pcVar17 = command._data;
      if (pFVar9 == (FILE *)0x0) break;
      if (((_stdin != pFVar9) && (_stdout != pFVar9)) && (iVar3 = fclose(pFVar9), iVar3 != 0)) {
        cimg::warn("cimg::fclose(): Error code %d returned during file closing.");
      }
    }
    pcVar6 = cimg::imagemagick_path((char *)0x0,false);
    pcVar15 = filename;
    do {
      pcVar13 = pcVar15;
      pcVar7 = strchr(pcVar13,0x2e);
      pcVar15 = pcVar7 + 1;
    } while (filename <= pcVar7 + 1);
    if (pcVar13 == filename) {
      sVar4 = strlen(filename);
      pcVar13 = filename + sVar4;
    }
    sVar4 = strlen(pcVar13);
    pcVar15 = s_filename._data;
    iVar2 = (int)sVar4;
    iVar3 = 3;
    if (iVar2 < 3) {
      iVar3 = iVar2;
    }
    uVar11 = iVar3 + 1;
    if (uVar11 == 0) {
      pcVar13 = " -density 400x400";
    }
    else {
      if (iVar2 < 0) {
        bVar18 = true;
        uVar12 = 0;
      }
      else {
        iVar3 = 3;
        if (iVar2 < 3) {
          iVar3 = iVar2;
        }
        uVar12 = 0;
        do {
          cVar1 = pcVar13[uVar12];
          cVar14 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar14 = cVar1;
          }
          cVar1 = "pdf"[uVar12];
          cVar16 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar16 = cVar1;
          }
          bVar18 = cVar14 == cVar16;
          if (!bVar18) goto LAB_00142cf3;
          uVar12 = uVar12 + 1;
        } while (iVar3 + 1 != (int)uVar12);
        uVar12 = (ulong)uVar11;
      }
LAB_00142cf3:
      pcVar13 = "";
      if (bVar18) {
        pcVar13 = " -density 400x400";
      }
      if ((uint)uVar12 == uVar11) {
        pcVar13 = " -density 400x400";
      }
    }
    CImg<char>::string(&local_b0,filename_tmp._data,true,false);
    pCVar5 = CImg<char>::_system_strescape(&local_b0);
    snprintf(pcVar17,(ulong)command._width,"%s%s \"%s\" \"%s\"",pcVar6,pcVar13,pcVar15,pCVar5->_data
            );
    if ((local_b0._is_shared == false) && (local_b0._data != (char *)0x0)) {
      operator_delete__(local_b0._data);
    }
    pcVar17 = command._data;
    cimg::imagemagick_path((char *)0x0,false);
    sVar4 = strlen(pcVar17);
    uVar12 = sVar4 & 0xffffffff;
    if (uVar12 != 0) {
      pcVar15 = (char *)operator_new__((ulong)((int)sVar4 + 0x10));
      strncpy(pcVar15,pcVar17,uVar12);
      builtin_strncpy(pcVar15 + uVar12," 2> /dev/null",0xe);
      system(pcVar15);
      operator_delete__(pcVar15);
    }
    pFVar9 = fopen(filename_tmp._data,"rb");
    if (pFVar9 == (FILE *)0x0) {
      pFVar9 = cimg::fopen(filename,"r");
      cimg::fclose(pFVar9);
      pCVar10 = (CImgIOException *)__cxa_allocate_exception(0x10);
      pcVar17 = "non-";
      if (this->_is_shared != false) {
        pcVar17 = "";
      }
      CImgIOException::CImgIOException
                (pCVar10,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_imagemagick_external(): Failed to load file \'%s\' with external command \'convert\'."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar17,"unsigned char",filename);
      __cxa_throw(pCVar10,&CImgIOException::typeinfo,CImgException::~CImgException);
    }
    if (((_stdin != pFVar9) && (_stdout != pFVar9)) && (iVar3 = fclose(pFVar9), iVar3 != 0)) {
      cimg::warn("cimg::fclose(): Error code %d returned during file closing.");
    }
    _load_pnm(this,(FILE *)0x0,filename_tmp._data);
    remove(filename_tmp._data);
  }
  else {
    cimg::_exception_mode(0,false);
    cimg::_exception_mode(0,true);
    _load_pnm(this,(FILE *)pFVar9,(char *)0x0);
    pclose(pFVar9);
  }
  if ((s_filename._is_shared == false) && (s_filename._data != (char *)0x0)) {
    operator_delete__(s_filename._data);
  }
  if ((filename_tmp._is_shared == false) && (filename_tmp._data != (char *)0x0)) {
    operator_delete__(filename_tmp._data);
  }
  if ((command._is_shared == false) && (command._data != (char *)0x0)) {
    operator_delete__(command._data);
  }
  return this;
}

Assistant:

CImg<T>& load_imagemagick_external(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_imagemagick_external(): Specified filename is (null).",
                                    cimg_instance);
      std::fclose(cimg::fopen(filename,"rb"));            // Check if file exists.
      CImg<charT> command(1024), filename_tmp(256);
      std::FILE *file = 0;
      const CImg<charT> s_filename = CImg<charT>::string(filename)._system_strescape();
#if cimg_OS==1
      cimg_snprintf(command,command._width,"%s%s \"%s\" pnm:-",
                    cimg::imagemagick_path(),
                    !cimg::strcasecmp(cimg::split_filename(filename),"pdf")?" -density 400x400":"",
                    s_filename.data());
      file = popen(command,"r");
      if (file) {
        const unsigned int omode = cimg::exception_mode();
        cimg::exception_mode(0);
        try { load_pnm(file); } catch (...) {
          pclose(file);
          cimg::exception_mode(omode);
          throw CImgIOException(_cimg_instance
                                "load_imagemagick_external(): Failed to load file '%s' with "
                                "external command 'convert'.",
                                cimg_instance,
                                filename);
        }
        pclose(file);
        return *this;
      }
#endif
      do {
        cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s.pnm",
                      cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        if ((file=std::fopen(filename_tmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(command,command._width,"%s%s \"%s\" \"%s\"",
                    cimg::imagemagick_path(),
                    !cimg::strcasecmp(cimg::split_filename(filename),"pdf")?" -density 400x400":"",
                    s_filename.data(),CImg<charT>::string(filename_tmp)._system_strescape().data());
      cimg::system(command,cimg::imagemagick_path());
      if (!(file = std::fopen(filename_tmp,"rb"))) {
        cimg::fclose(cimg::fopen(filename,"r"));
        throw CImgIOException(_cimg_instance
                              "load_imagemagick_external(): Failed to load file '%s' with external command 'convert'.",
                              cimg_instance,
                              filename);

      } else cimg::fclose(file);
      load_pnm(filename_tmp);
      std::remove(filename_tmp);
      return *this;
    }